

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.h
# Opt level: O2

char * __thiscall
MeCab::CharProperty::seekToOtherType
          (CharProperty *this,char *begin,char *end,CharInfo c,CharInfo *fail,size_t *mblen,
          size_t *clen)

{
  CharInfo CVar1;
  
  *clen = 0;
  while( true ) {
    if (begin == end) {
      return begin;
    }
    CVar1 = getCharInfo(this,begin,end,mblen);
    *fail = CVar1;
    if (((uint)c & (uint)CVar1 & 0x3ffff) == 0) break;
    begin = begin + *mblen;
    *clen = *clen + 1;
    c = *fail;
  }
  return begin;
}

Assistant:

inline const char *seekToOtherType(const char *begin, const char *end,
                                     CharInfo c, CharInfo *fail,
                                     size_t *mblen, size_t *clen) const {
    register const char *p =  begin;
    *clen = 0;
    while (p != end && c.isKindOf(*fail = getCharInfo(p, end, mblen))) {
      p += *mblen;
      ++(*clen);
      c = *fail;
    }
    return p;
  }